

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsip.cpp
# Opt level: O1

int __thiscall tsip::update_report(tsip *this)

{
  byte *pbVar1;
  ulong uVar2;
  byte bVar3;
  UINT8 UVar4;
  ushort uVar5;
  undefined2 uVar6;
  uint uVar7;
  uint uVar8;
  undefined4 uVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [11];
  undefined1 auVar52 [15];
  undefined1 auVar53 [11];
  undefined1 auVar54 [15];
  undefined1 auVar55 [11];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  int k;
  long lVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  
  if (this->verbose == true) {
    printf("Found Report: %x-%x\n",(ulong)(this->m_report).raw.data[0],
           (ulong)(this->m_report).raw.data[1]);
  }
  bVar3 = (this->m_report).raw.data[0];
  if (bVar3 < 0x56) {
    switch(bVar3) {
    case 0x42:
      *(byte *)&this->m_updated = *(byte *)&this->m_updated | 1;
      (this->m_ecef_position_s).valid = true;
      uVar8 = *(uint *)((long)&this->m_report + 2);
      uVar7 = *(uint *)((long)&this->m_report + 6);
      (this->m_ecef_position_s).report.x =
           (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                       uVar8 << 0x18);
      (this->m_ecef_position_s).report.y =
           (float)(int)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                       uVar7 << 0x18);
      uVar8 = *(uint *)((long)&this->m_report + 10);
      (this->m_ecef_position_s).report.z =
           (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                       uVar8 << 0x18);
      uVar8 = *(uint *)((long)&this->m_report + 0xe);
      (this->m_ecef_position_s).report.time_of_fix =
           (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                       uVar8 << 0x18);
      break;
    case 0x43:
      *(byte *)&this->m_updated = *(byte *)&this->m_updated | 4;
      (this->m_ecef_velocity).valid = true;
      break;
    case 0x45:
      *(byte *)&this->m_updated = *(byte *)&this->m_updated | 8;
      (this->m_sw_version).valid = true;
      break;
    case 0x4a:
      *(byte *)&this->m_updated = *(byte *)&this->m_updated | 0x10;
      (this->m_single_position).valid = true;
      break;
    default:
      if (bVar3 == 0x55) {
        *(byte *)&this->m_updated = *(byte *)&this->m_updated | 0x40;
        (this->m_io_options).valid = true;
        break;
      }
    case 0x44:
    case 0x46:
    case 0x47:
    case 0x48:
    case 0x49:
switchD_0010360f_caseD_44:
      pbVar1 = (byte *)((long)&this->m_updated + 1);
      *pbVar1 = *pbVar1 | 0x80;
      (this->m_unknown).valid = true;
    }
LAB_0010397b:
    if (this->debug == true) {
      puts("command buffer:");
      lVar62 = 0;
      do {
        printf(" %x",(ulong)*(byte *)((long)&this->m_command + lVar62));
        lVar62 = lVar62 + 1;
      } while (lVar62 != 0x18);
      putchar(10);
      puts("\nreport buffer:");
      if (0 < this->m_report_length) {
        lVar62 = 0;
        do {
          printf(" %x",(ulong)*(byte *)((long)&this->m_report + lVar62));
          lVar62 = lVar62 + 1;
        } while (lVar62 < this->m_report_length);
      }
      putchar(10);
    }
    return 1;
  }
  if (bVar3 < 0x84) {
    if (bVar3 == 0x56) {
      *(byte *)&this->m_updated = *(byte *)&this->m_updated | 0x80;
      (this->m_enu_velocity).valid = true;
      goto LAB_0010397b;
    }
    if (bVar3 == 0x83) {
      *(byte *)&this->m_updated = *(byte *)&this->m_updated | 2;
      (this->m_ecef_position_d).valid = true;
      goto LAB_0010397b;
    }
  }
  else {
    if (bVar3 == 0x84) {
      *(byte *)&this->m_updated = *(byte *)&this->m_updated | 0x20;
      (this->m_double_position).valid = true;
      goto LAB_0010397b;
    }
    if (bVar3 == 0x8f) {
      UVar4 = (this->m_report).raw.data[1];
      uVar5 = *(ushort *)&this->m_updated;
      if (UVar4 == 0xac) {
        *(ushort *)&this->m_updated = uVar5 | 0x200;
        (this->m_secondary_time).valid = true;
        (this->m_secondary_time).report.receiver_mode = (this->m_report).raw.data[2];
        uVar6 = *(undefined2 *)((long)&this->m_report + 3);
        (this->m_secondary_time).report.disciplining_mode = (char)uVar6;
        (this->m_secondary_time).report.self_survey_progress = (char)((ushort)uVar6 >> 8);
        uVar8 = *(uint *)((long)&this->m_report + 5);
        (this->m_secondary_time).report.holdover_duration =
             uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
        uVar5 = *(ushort *)((long)&this->m_report + 9);
        (this->m_secondary_time).report.critical_alarms.value = uVar5 << 8 | uVar5 >> 8;
        uVar5 = *(ushort *)((long)&this->m_report + 0xb);
        (this->m_secondary_time).report.minor_alarms.value = uVar5 << 8 | uVar5 >> 8;
        uVar9 = *(undefined4 *)((long)&this->m_report + 0xd);
        (this->m_secondary_time).report.gps_decoding_status = (char)uVar9;
        (this->m_secondary_time).report.disciplining_activity = (char)((uint)uVar9 >> 8);
        (this->m_secondary_time).report.spare_status1 = (char)((uint)uVar9 >> 0x10);
        (this->m_secondary_time).report.spare_status2 = (char)((uint)uVar9 >> 0x18);
        uVar9 = *(undefined4 *)((long)&this->m_report + 0x11);
        auVar69._8_8_ = 0;
        auVar69._0_8_ =
             (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)uVar9 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar9 >> 0x10),uVar9)) >>
                                                  0x20),uVar9) >> 0x18),
                                             CONCAT12((char)((uint)uVar9 >> 8),(short)uVar9)) >>
                                   0x10),(short)uVar9) & 0xffff00ff00ff00ff;
        auVar63 = pshuflw(auVar69,auVar69,0x1b);
        sVar10 = auVar63._0_2_;
        sVar11 = auVar63._2_2_;
        sVar12 = auVar63._4_2_;
        sVar13 = auVar63._6_2_;
        (this->m_secondary_time).report.pps_offset =
             (SINGLE)CONCAT13((0 < sVar13) * (sVar13 < 0x100) * auVar63[6] - (0xff < sVar13),
                              CONCAT12((0 < sVar12) * (sVar12 < 0x100) * auVar63[4] -
                                       (0xff < sVar12),
                                       CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar63[2] -
                                                (0xff < sVar11),
                                                (0 < sVar10) * (sVar10 < 0x100) * auVar63[0] -
                                                (0xff < sVar10))));
        uVar9 = *(undefined4 *)((long)&this->m_report + 0x15);
        auVar64._8_8_ = 0;
        auVar64._0_8_ =
             (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)uVar9 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar9 >> 0x10),uVar9)) >>
                                                  0x20),uVar9) >> 0x18),
                                             CONCAT12((char)((uint)uVar9 >> 8),(short)uVar9)) >>
                                   0x10),(short)uVar9) & 0xffff00ff00ff00ff;
        auVar63 = pshuflw(auVar64,auVar64,0x1b);
        sVar10 = auVar63._0_2_;
        sVar11 = auVar63._2_2_;
        sVar12 = auVar63._4_2_;
        sVar13 = auVar63._6_2_;
        (this->m_secondary_time).report.tenMHz_offset =
             (SINGLE)CONCAT13((0 < sVar13) * (sVar13 < 0x100) * auVar63[6] - (0xff < sVar13),
                              CONCAT12((0 < sVar12) * (sVar12 < 0x100) * auVar63[4] -
                                       (0xff < sVar12),
                                       CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar63[2] -
                                                (0xff < sVar11),
                                                (0 < sVar10) * (sVar10 < 0x100) * auVar63[0] -
                                                (0xff < sVar10))));
        uVar8 = *(uint *)((long)&this->m_report + 0x19);
        (this->m_secondary_time).report.dac_value =
             uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
        uVar9 = *(undefined4 *)((long)&this->m_report + 0x1d);
        auVar65._8_8_ = 0;
        auVar65._0_8_ =
             (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)uVar9 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar9 >> 0x10),uVar9)) >>
                                                  0x20),uVar9) >> 0x18),
                                             CONCAT12((char)((uint)uVar9 >> 8),(short)uVar9)) >>
                                   0x10),(short)uVar9) & 0xffff00ff00ff00ff;
        auVar63 = pshuflw(auVar65,auVar65,0x1b);
        sVar10 = auVar63._0_2_;
        sVar11 = auVar63._2_2_;
        sVar12 = auVar63._4_2_;
        sVar13 = auVar63._6_2_;
        (this->m_secondary_time).report.dac_voltage =
             (SINGLE)CONCAT13((0 < sVar13) * (sVar13 < 0x100) * auVar63[6] - (0xff < sVar13),
                              CONCAT12((0 < sVar12) * (sVar12 < 0x100) * auVar63[4] -
                                       (0xff < sVar12),
                                       CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar63[2] -
                                                (0xff < sVar11),
                                                (0 < sVar10) * (sVar10 < 0x100) * auVar63[0] -
                                                (0xff < sVar10))));
        uVar9 = *(undefined4 *)((long)&this->m_report + 0x21);
        auVar66._8_8_ = 0;
        auVar66._0_8_ =
             (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)uVar9 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar9 >> 0x10),uVar9)) >>
                                                  0x20),uVar9) >> 0x18),
                                             CONCAT12((char)((uint)uVar9 >> 8),(short)uVar9)) >>
                                   0x10),(short)uVar9) & 0xffff00ff00ff00ff;
        auVar63 = pshuflw(auVar66,auVar66,0x1b);
        sVar10 = auVar63._0_2_;
        sVar11 = auVar63._2_2_;
        sVar12 = auVar63._4_2_;
        sVar13 = auVar63._6_2_;
        (this->m_secondary_time).report.temperature =
             (SINGLE)CONCAT13((0 < sVar13) * (sVar13 < 0x100) * auVar63[6] - (0xff < sVar13),
                              CONCAT12((0 < sVar12) * (sVar12 < 0x100) * auVar63[4] -
                                       (0xff < sVar12),
                                       CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar63[2] -
                                                (0xff < sVar11),
                                                (0 < sVar10) * (sVar10 < 0x100) * auVar63[0] -
                                                (0xff < sVar10))));
        uVar2 = *(ulong *)((long)&this->m_report + 0x25);
        auVar26._8_6_ = 0;
        auVar26._0_8_ = uVar2;
        auVar26[0xe] = (char)(uVar2 >> 0x38);
        auVar29._8_4_ = 0;
        auVar29._0_8_ = uVar2;
        auVar29[0xc] = (char)(uVar2 >> 0x30);
        auVar29._13_2_ = auVar26._13_2_;
        auVar32._8_4_ = 0;
        auVar32._0_8_ = uVar2;
        auVar32._12_3_ = auVar29._12_3_;
        auVar35._8_2_ = 0;
        auVar35._0_8_ = uVar2;
        auVar35[10] = (char)(uVar2 >> 0x28);
        auVar35._11_4_ = auVar32._11_4_;
        auVar38._8_2_ = 0;
        auVar38._0_8_ = uVar2;
        auVar38._10_5_ = auVar35._10_5_;
        auVar41[8] = (char)(uVar2 >> 0x20);
        auVar41._0_8_ = uVar2;
        auVar41._9_6_ = auVar38._9_6_;
        auVar67[7] = 0;
        auVar67._0_7_ = auVar41._8_7_;
        auVar50._7_8_ = 0;
        auVar50._0_7_ = auVar41._8_7_;
        auVar56._1_8_ = SUB158(auVar50 << 0x40,7);
        auVar56[0] = (char)(uVar2 >> 0x18);
        auVar56._9_6_ = 0;
        auVar51._1_10_ = SUB1510(auVar56 << 0x30,5);
        auVar51[0] = (char)(uVar2 >> 0x10);
        auVar57._11_4_ = 0;
        auVar57._0_11_ = auVar51;
        auVar44[2] = (char)(uVar2 >> 8);
        auVar44._0_2_ = (ushort)uVar2;
        auVar44._3_12_ = SUB1512(auVar57 << 0x20,3);
        auVar47._2_13_ = auVar44._2_13_;
        auVar47._0_2_ = (ushort)uVar2 & 0xff;
        auVar67._8_4_ = auVar47._0_4_;
        auVar67._12_4_ = auVar51._0_4_;
        auVar63 = pshuflw(auVar67,auVar67,0x1b);
        auVar63 = pshufhw(auVar63,auVar63,0x1b);
        sVar10 = auVar63._0_2_;
        sVar11 = auVar63._2_2_;
        sVar12 = auVar63._4_2_;
        sVar13 = auVar63._6_2_;
        sVar14 = auVar63._8_2_;
        sVar15 = auVar63._10_2_;
        sVar16 = auVar63._12_2_;
        sVar17 = auVar63._14_2_;
        (this->m_secondary_time).report.latitude =
             (DOUBLE)CONCAT17((0 < sVar17) * (sVar17 < 0x100) * auVar63[0xe] - (0xff < sVar17),
                              CONCAT16((0 < sVar16) * (sVar16 < 0x100) * auVar63[0xc] -
                                       (0xff < sVar16),
                                       CONCAT15((0 < sVar15) * (sVar15 < 0x100) * auVar63[10] -
                                                (0xff < sVar15),
                                                CONCAT14((0 < sVar14) * (sVar14 < 0x100) *
                                                         auVar63[8] - (0xff < sVar14),
                                                         CONCAT13((0 < sVar13) * (sVar13 < 0x100) *
                                                                  auVar63[6] - (0xff < sVar13),
                                                                  CONCAT12((0 < sVar12) *
                                                                           (sVar12 < 0x100) *
                                                                           auVar63[4] -
                                                                           (0xff < sVar12),
                                                                           CONCAT11((0 < sVar11) *
                                                                                    (sVar11 < 0x100)
                                                                                    * auVar63[2] -
                                                                                    (0xff < sVar11),
                                                                                    (0 < sVar10) *
                                                                                    (sVar10 < 0x100)
                                                                                    * auVar63[0] -
                                                                                    (0xff < sVar10))
                                                                          ))))));
        uVar2 = *(ulong *)((long)&this->m_report + 0x2d);
        auVar27._8_6_ = 0;
        auVar27._0_8_ = uVar2;
        auVar27[0xe] = (char)(uVar2 >> 0x38);
        auVar30._8_4_ = 0;
        auVar30._0_8_ = uVar2;
        auVar30[0xc] = (char)(uVar2 >> 0x30);
        auVar30._13_2_ = auVar27._13_2_;
        auVar33._8_4_ = 0;
        auVar33._0_8_ = uVar2;
        auVar33._12_3_ = auVar30._12_3_;
        auVar36._8_2_ = 0;
        auVar36._0_8_ = uVar2;
        auVar36[10] = (char)(uVar2 >> 0x28);
        auVar36._11_4_ = auVar33._11_4_;
        auVar39._8_2_ = 0;
        auVar39._0_8_ = uVar2;
        auVar39._10_5_ = auVar36._10_5_;
        auVar42[8] = (char)(uVar2 >> 0x20);
        auVar42._0_8_ = uVar2;
        auVar42._9_6_ = auVar39._9_6_;
        auVar68[7] = 0;
        auVar68._0_7_ = auVar42._8_7_;
        auVar52._7_8_ = 0;
        auVar52._0_7_ = auVar42._8_7_;
        auVar58._1_8_ = SUB158(auVar52 << 0x40,7);
        auVar58[0] = (char)(uVar2 >> 0x18);
        auVar58._9_6_ = 0;
        auVar53._1_10_ = SUB1510(auVar58 << 0x30,5);
        auVar53[0] = (char)(uVar2 >> 0x10);
        auVar59._11_4_ = 0;
        auVar59._0_11_ = auVar53;
        auVar45[2] = (char)(uVar2 >> 8);
        auVar45._0_2_ = (ushort)uVar2;
        auVar45._3_12_ = SUB1512(auVar59 << 0x20,3);
        auVar48._2_13_ = auVar45._2_13_;
        auVar48._0_2_ = (ushort)uVar2 & 0xff;
        auVar68._8_4_ = auVar48._0_4_;
        auVar68._12_4_ = auVar53._0_4_;
        auVar63 = pshuflw(auVar68,auVar68,0x1b);
        auVar69 = pshufhw(auVar63,auVar63,0x1b);
        uVar2 = *(ulong *)((long)&this->m_report + 0x35);
        auVar28._8_6_ = 0;
        auVar28._0_8_ = uVar2;
        auVar28[0xe] = (char)(uVar2 >> 0x38);
        auVar31._8_4_ = 0;
        auVar31._0_8_ = uVar2;
        auVar31[0xc] = (char)(uVar2 >> 0x30);
        auVar31._13_2_ = auVar28._13_2_;
        auVar34._8_4_ = 0;
        auVar34._0_8_ = uVar2;
        auVar34._12_3_ = auVar31._12_3_;
        auVar37._8_2_ = 0;
        auVar37._0_8_ = uVar2;
        auVar37[10] = (char)(uVar2 >> 0x28);
        auVar37._11_4_ = auVar34._11_4_;
        auVar40._8_2_ = 0;
        auVar40._0_8_ = uVar2;
        auVar40._10_5_ = auVar37._10_5_;
        auVar43[8] = (char)(uVar2 >> 0x20);
        auVar43._0_8_ = uVar2;
        auVar43._9_6_ = auVar40._9_6_;
        auVar63[7] = 0;
        auVar63._0_7_ = auVar43._8_7_;
        auVar54._7_8_ = 0;
        auVar54._0_7_ = auVar43._8_7_;
        auVar60._1_8_ = SUB158(auVar54 << 0x40,7);
        auVar60[0] = (char)(uVar2 >> 0x18);
        auVar60._9_6_ = 0;
        auVar55._1_10_ = SUB1510(auVar60 << 0x30,5);
        auVar55[0] = (char)(uVar2 >> 0x10);
        auVar61._11_4_ = 0;
        auVar61._0_11_ = auVar55;
        auVar46[2] = (char)(uVar2 >> 8);
        auVar46._0_2_ = (ushort)uVar2;
        auVar46._3_12_ = SUB1512(auVar61 << 0x20,3);
        auVar49._2_13_ = auVar46._2_13_;
        auVar49._0_2_ = (ushort)uVar2 & 0xff;
        auVar63._8_4_ = auVar49._0_4_;
        auVar63._12_4_ = auVar55._0_4_;
        auVar63 = pshuflw(auVar63,auVar63,0x1b);
        auVar63 = pshufhw(auVar63,auVar63,0x1b);
        sVar10 = auVar69._0_2_;
        sVar11 = auVar69._2_2_;
        sVar12 = auVar69._4_2_;
        sVar13 = auVar69._6_2_;
        sVar14 = auVar69._8_2_;
        sVar15 = auVar69._10_2_;
        sVar16 = auVar69._12_2_;
        sVar17 = auVar69._14_2_;
        sVar18 = auVar63._0_2_;
        sVar19 = auVar63._2_2_;
        sVar20 = auVar63._4_2_;
        sVar21 = auVar63._6_2_;
        sVar22 = auVar63._8_2_;
        sVar23 = auVar63._10_2_;
        sVar24 = auVar63._12_2_;
        sVar25 = auVar63._14_2_;
        *(char *)&(this->m_secondary_time).report.longitude =
             (0 < sVar10) * (sVar10 < 0x100) * auVar69[0] - (0xff < sVar10);
        *(char *)((long)&(this->m_secondary_time).report.longitude + 1) =
             (0 < sVar11) * (sVar11 < 0x100) * auVar69[2] - (0xff < sVar11);
        *(char *)((long)&(this->m_secondary_time).report.longitude + 2) =
             (0 < sVar12) * (sVar12 < 0x100) * auVar69[4] - (0xff < sVar12);
        *(char *)((long)&(this->m_secondary_time).report.longitude + 3) =
             (0 < sVar13) * (sVar13 < 0x100) * auVar69[6] - (0xff < sVar13);
        *(char *)((long)&(this->m_secondary_time).report.longitude + 4) =
             (0 < sVar14) * (sVar14 < 0x100) * auVar69[8] - (0xff < sVar14);
        *(char *)((long)&(this->m_secondary_time).report.longitude + 5) =
             (0 < sVar15) * (sVar15 < 0x100) * auVar69[10] - (0xff < sVar15);
        *(char *)((long)&(this->m_secondary_time).report.longitude + 6) =
             (0 < sVar16) * (sVar16 < 0x100) * auVar69[0xc] - (0xff < sVar16);
        *(char *)((long)&(this->m_secondary_time).report.longitude + 7) =
             (0 < sVar17) * (sVar17 < 0x100) * auVar69[0xe] - (0xff < sVar17);
        *(char *)&(this->m_secondary_time).report.altitude =
             (0 < sVar18) * (sVar18 < 0x100) * auVar63[0] - (0xff < sVar18);
        *(char *)((long)&(this->m_secondary_time).report.altitude + 1) =
             (0 < sVar19) * (sVar19 < 0x100) * auVar63[2] - (0xff < sVar19);
        *(char *)((long)&(this->m_secondary_time).report.altitude + 2) =
             (0 < sVar20) * (sVar20 < 0x100) * auVar63[4] - (0xff < sVar20);
        *(char *)((long)&(this->m_secondary_time).report.altitude + 3) =
             (0 < sVar21) * (sVar21 < 0x100) * auVar63[6] - (0xff < sVar21);
        *(char *)((long)&(this->m_secondary_time).report.altitude + 4) =
             (0 < sVar22) * (sVar22 < 0x100) * auVar63[8] - (0xff < sVar22);
        *(char *)((long)&(this->m_secondary_time).report.altitude + 5) =
             (0 < sVar23) * (sVar23 < 0x100) * auVar63[10] - (0xff < sVar23);
        *(char *)((long)&(this->m_secondary_time).report.altitude + 6) =
             (0 < sVar24) * (sVar24 < 0x100) * auVar63[0xc] - (0xff < sVar24);
        *(char *)((long)&(this->m_secondary_time).report.altitude + 7) =
             (0 < sVar25) * (sVar25 < 0x100) * auVar63[0xe] - (0xff < sVar25);
        *(undefined8 *)(this->m_secondary_time).report.spare =
             *(undefined8 *)((long)&this->m_report + 0x3d);
      }
      else if (UVar4 == 0xab) {
        *(ushort *)&this->m_updated = uVar5 | 0x100;
        (this->m_primary_time).valid = true;
        uVar8 = *(uint *)((long)&this->m_report + 2);
        (this->m_primary_time).report.seconds_of_week =
             uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
        uVar5 = *(ushort *)((long)&this->m_report + 6);
        (this->m_primary_time).report.week_number = uVar5 << 8 | uVar5 >> 8;
        uVar5 = *(ushort *)((long)&this->m_report + 8);
        (this->m_primary_time).report.utc_offset = uVar5 << 8 | uVar5 >> 8;
        uVar9 = *(undefined4 *)((long)&this->m_report + 10);
        (this->m_primary_time).report.flags = (_flags)(char)uVar9;
        (this->m_primary_time).report.seconds = (char)((uint)uVar9 >> 8);
        (this->m_primary_time).report.minutes = (char)((uint)uVar9 >> 0x10);
        (this->m_primary_time).report.hours = (char)((uint)uVar9 >> 0x18);
        uVar6 = *(undefined2 *)((long)&this->m_report + 0xe);
        (this->m_primary_time).report.day = (char)uVar6;
        (this->m_primary_time).report.month = (char)((ushort)uVar6 >> 8);
        uVar5 = *(ushort *)((long)&this->m_report + 0x10);
        (this->m_primary_time).report.year = uVar5 << 8 | uVar5 >> 8;
      }
      else if (UVar4 == 0xa2) {
        *(ushort *)&this->m_updated = uVar5 | 0x400;
        (this->m_utc_gps_time).valid = true;
        (this->m_utc_gps_time).report.bits = *(_flags *)((this->m_report).raw.data + 2);
      }
      else {
        *(ushort *)&this->m_updated = uVar5 | 0x8000;
        (this->m_unknown).valid = true;
      }
    }
  }
  goto switchD_0010360f_caseD_44;
}

Assistant:

int tsip::update_report()
{
	void *src;
	void *dst;
	int  rlen = 0;

	if (verbose) printf("Found Report: %x-%x\n",m_report.report.code,m_report.extended.subcode);
	// save report
	switch (m_report.report.code) {

	case REPORT_ECEF_POSITION_S:
		m_updated.report.ecef_position_s = 1;
		m_ecef_position_s.valid = true;
		rlen = sizeof(m_ecef_position_s.report);

		m_ecef_position_s.report.x = (m_report.extended.data[0] << 24) + (m_report.extended.data[1] << 16) + (m_report.extended.data[2] << 8) + m_report.extended.data[3];
		m_ecef_position_s.report.y = (m_report.extended.data[4] << 24) + (m_report.extended.data[5] << 16) + (m_report.extended.data[6] << 8) + m_report.extended.data[7];
		m_ecef_position_s.report.z = (m_report.extended.data[8] << 24) + (m_report.extended.data[9] << 16) + (m_report.extended.data[10] << 8) + m_report.extended.data[11];
		m_ecef_position_s.report.time_of_fix = (m_report.extended.data[12] << 24) + (m_report.extended.data[13] << 16) + (m_report.extended.data[14] << 8) + m_report.extended.data[15];

		break;

	case REPORT_ECEF_POSITION_D:
		m_updated.report.ecef_position_d = 1;
		m_ecef_position_d.valid = true;
		src = m_report.report.data;
		dst = &m_ecef_position_d.report;
		rlen = sizeof(m_ecef_position_d.report);
		break;

	case REPORT_ECEF_VELOCITY:
		m_updated.report.ecef_velocity = 1;
		m_ecef_velocity.valid = true;
		src = m_report.report.data;
		dst = &m_ecef_velocity.report;
		rlen = sizeof(m_ecef_velocity.report);
		break;

	case REPORT_SW_VERSION:
		m_updated.report.sw_version = 1;
		m_sw_version.valid = true;
		src = m_report.report.data;
		dst = &m_sw_version.report;
		rlen = sizeof(m_sw_version.report);
		break;

	case REPORT_SINGLE_POSITION:
		m_updated.report.single_position = 1;
		m_single_position.valid = true;
		src = m_report.report.data;
		dst = &m_single_position.report;
		rlen = sizeof(m_single_position.report);
		break;

	case REPORT_DOUBLE_POSITION:
		m_updated.report.double_position = 1;
		m_double_position.valid = true;
		src = m_report.report.data;
		dst = &m_double_position.report;
		rlen = sizeof(m_single_position.report);
		break;

	case REPORT_IO_OPTIONS:
		m_updated.report.io_options = 1;
		m_io_options.valid = true;
		src = m_report.report.data;
		dst = &m_io_options.report;
		rlen = sizeof(m_io_options.report);
		break;

	case REPORT_ENU_VELOCITY:
		m_updated.report.enu_velocity = 1;
		m_enu_velocity.valid = true;
		src = m_report.report.data;
		dst = &m_enu_velocity.report;
		rlen = sizeof(m_enu_velocity.report);
		break;

	case REPORT_SUPER:
		switch (m_report.extended.subcode) {

		// 8f-a2
		case REPORT_SUPER_UTC_GPS_TIME:
			m_updated.report.utc_gps_time = 1;
			m_utc_gps_time.valid = true;
			rlen = sizeof(m_utc_gps_time.report);

			m_utc_gps_time.report.bits.value = m_report.extended.data[0];
			break;

		// 8f-ab
		case REPORT_SUPER_PRIMARY_TIME:
			m_updated.report.primary_time = 1;
			m_primary_time.valid = true;
			rlen = sizeof(m_primary_time.report);

			m_primary_time.report.seconds_of_week = b4_to_uint32(0,'e');
			m_primary_time.report.week_number = b2_to_uint16(4,'e');
			m_primary_time.report.utc_offset = b2_to_uint16(6,'e');
			m_primary_time.report.flags.value = m_report.extended.data[8];
			m_primary_time.report.seconds = m_report.extended.data[9];
			m_primary_time.report.minutes = m_report.extended.data[10];
			m_primary_time.report.hours = m_report.extended.data[11];
			m_primary_time.report.day = m_report.extended.data[12];
			m_primary_time.report.month = m_report.extended.data[13];
			m_primary_time.report.year = b2_to_uint16(14,'e');

			break;

		// 8f-ac
		case REPORT_SUPER_SECONDARY_TIME:
			m_updated.report.secondary_time = 1;
			m_secondary_time.valid = true;
			rlen = sizeof(m_secondary_time.report);

			m_secondary_time.report.receiver_mode = m_report.extended.data[0];
			m_secondary_time.report.disciplining_mode = m_report.extended.data[1];
			m_secondary_time.report.self_survey_progress = m_report.extended.data[2];
			m_secondary_time.report.holdover_duration = b4_to_uint32(3,'e');
			m_secondary_time.report.critical_alarms.value = b2_to_uint16(7,'e');
			m_secondary_time.report.minor_alarms.value = b2_to_uint16(9,'e');;
			m_secondary_time.report.gps_decoding_status = m_report.extended.data[11];
			m_secondary_time.report.disciplining_activity = m_report.extended.data[12];
			m_secondary_time.report.spare_status1 = m_report.extended.data[13];
			m_secondary_time.report.spare_status2 = m_report.extended.data[14];

			m_secondary_time.report.pps_offset = b4_to_single(15,'e');
			m_secondary_time.report.tenMHz_offset = b4_to_single(19,'e');
			m_secondary_time.report.dac_value = b4_to_uint32(23,'e');
			m_secondary_time.report.dac_voltage = b4_to_single(27,'e');
			m_secondary_time.report.temperature = b4_to_single(31,'e');

			m_secondary_time.report.latitude = b8_to_double(35,'e');
			m_secondary_time.report.longitude = b8_to_double(43,'e');
			m_secondary_time.report.altitude = b8_to_double(51,'e');

			m_secondary_time.report.spare[0] = m_report.extended.data[59];
			m_secondary_time.report.spare[1] = m_report.extended.data[60];
			m_secondary_time.report.spare[2] = m_report.extended.data[61];
			m_secondary_time.report.spare[3] = m_report.extended.data[62];
			m_secondary_time.report.spare[4] = m_report.extended.data[63];
			m_secondary_time.report.spare[5] = m_report.extended.data[64];
			m_secondary_time.report.spare[6] = m_report.extended.data[65];
			m_secondary_time.report.spare[7] = m_report.extended.data[66];
			break;

		default:
			m_updated.report.unknown = 1;
			m_unknown.valid = true;
		    src = m_report.raw.data;
			dst = m_unknown.report.raw.data;
			rlen = sizeof(m_unknown.report.raw.data);
			break;
		}

	default:
		m_updated.report.unknown = 1;
		m_unknown.valid = true;
	    src = m_report.raw.data;
		dst = m_unknown.report.raw.data;
		rlen = sizeof(m_unknown.report.raw.data);
        break;
	}

	// report strucute updated
	if (rlen > 0 ) {
		if (debug) {
			printf("command buffer:\n");
			for (int k=0;k<24;k++){printf(" %x",m_command.raw.data[k]);}
			printf("\n");
			printf("\nreport buffer:\n");
			for (int k=0;k<m_report_length;k++){printf(" %x",m_report.raw.data[k]);}
			printf("\n");
		}


		return 1;
	}


	return 0;
}